

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteMessage.cpp
# Opt level: O0

DeleteMessage * __thiscall DeleteMessage::execute_abi_cxx11_(DeleteMessage *this)

{
  bool bVar1;
  char *pcVar2;
  long in_RSI;
  allocator local_113;
  allocator local_112;
  allocator local_111;
  string local_110 [32];
  string local_f0 [36];
  undefined4 local_cc;
  string local_c8 [32];
  dirent *local_a8;
  dirent *userDirEntry;
  DIR *userDir;
  allocator local_81;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string dir;
  int local_20;
  int local_1c;
  int delete_result;
  int count;
  DeleteMessage *this_local;
  
  local_1c = 0;
  local_20 = 1;
  pcVar2 = *(char **)(in_RSI + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,pcVar2,&local_81);
  std::operator+(local_60,(char *)local_80);
  std::operator+(local_40,local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  userDirEntry = (dirent *)opendir(pcVar2);
  if (userDirEntry == (dirent *)0x0) {
    std::__cxx11::string::operator=((string *)(in_RSI + 8),(char *)(in_RSI + 0x3a));
    closedir((DIR *)userDirEntry);
    std::operator+((char *)local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "No such User \"");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)local_c8);
    std::__cxx11::string::~string(local_c8);
  }
  else {
    while( true ) {
      local_a8 = readdir((DIR *)userDirEntry);
      bVar1 = false;
      if (local_a8 != (dirent *)0x0) {
        bVar1 = local_1c <= *(int *)(in_RSI + 0x6c);
      }
      if (!bVar1) break;
      if ((local_a8->d_type == '\b') &&
         (local_1c = local_1c + 1, local_1c == *(int *)(in_RSI + 0x6c))) {
        pcVar2 = local_a8->d_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_110,pcVar2,&local_111);
        std::operator+((char *)local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/");
        std::__cxx11::string::operator+=((string *)local_40,local_f0);
        std::__cxx11::string::~string(local_f0);
        std::__cxx11::string::~string(local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        local_20 = remove(pcVar2);
        if (local_20 == 0) {
          std::__cxx11::string::operator=((string *)(in_RSI + 8),(char *)(in_RSI + 0x36));
        }
        else {
          std::__cxx11::string::operator=((string *)(in_RSI + 8),(char *)(in_RSI + 0x3a));
        }
      }
    }
    if (local_20 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"Message deleted",&local_112);
      std::allocator<char>::~allocator((allocator<char> *)&local_112);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"Delete not successful",&local_113);
      std::allocator<char>::~allocator((allocator<char> *)&local_113);
    }
  }
  local_cc = 1;
  std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

string DeleteMessage::execute() {
    int count = 0;
    int delete_result = 1;
    ///create and parse a path to the correct user directory
    string dir = string(MESSAGEDIR) + "/" + username;

    ///open the user directory with the input path
    DIR* userDir = opendir(dir.c_str()); //Open User Directory

    struct dirent * userDirEntry; //individual entries in the directory.

    ///if no directory found return 0
    if(userDir == nullptr){
        statusMessage = FAILURE;
        closedir(userDir);
        return "No such User \"" + username + "\" found\n";
    }

    ///while directory isn't empty or didn't reach right file keep looking:
    while ((userDirEntry = readdir(userDir)) != nullptr && count <= chosen_message) {
        ///check if the file is a regular type
        if (userDirEntry->d_type == DT_REG) {
            //count as countable file
            count++;
            if (count == chosen_message) {
                //deleting if reached correct file
                dir += "/" + string(userDirEntry->d_name);
                delete_result = remove(dir.c_str());
                ///check if remove function returned 0 for success or other code for failure
                if(delete_result == 0){
                    statusMessage = SUCCESS;
                }else{
                    statusMessage = FAILURE;
                }
            }
        }
    }

    ///return the correct string to give user the information about success or failure
    if(delete_result == 0){
        return "Message deleted";
    }else{
        return "Delete not successful";
    }
}